

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

char * GrowSubId(char **p)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char p_00;
  int iVar4;
  char *pcVar5;
  
  cVar2 = DAT_0018a517;
  pcVar5 = *p;
  cVar1 = *pcVar5;
  p_00 = cVar1;
  do {
    iVar4 = islabchar(p_00);
    if (iVar4 == 0) break;
    *p = pcVar5 + 1;
    pcVar3 = nidsubp + 1;
    *nidsubp = *pcVar5;
    nidsubp = pcVar3;
    pcVar5 = *p;
    p_00 = *pcVar5;
  } while ((cVar2 == '\0') || ((cVar1 != '_') == (p_00 != '_')));
  if (nidtemp + 0x7ff < nidsubp) {
    Error("ID too long, buffer overflow detected.",(char *)0x0,FATAL);
  }
  *nidsubp = '\0';
  pcVar5 = (char *)0x0;
  if (nidtemp[0] != '\0') {
    pcVar5 = nidtemp;
  }
  return pcVar5;
}

Assistant:

char* GrowSubId(char* & p) {	// appends next part of ID
	// The caller function ReplaceDefineInternal already assures the first char of ID is (isalpha() || '_')
	// so there are no extra tests here to verify validity of first character (like GetID(..) must do)
	const bool isSubwordSubstitution = Options::syx.IsSubwordSubstitution;	// help compiler -O2
	bool startsAtUnderscore = ('_' == *p);
	// add sub-parts delimiter in separate step (i.e. new ID grows like: "a", "a_", "a_b", ...)
	while (islabchar(*p)) {
		*nidsubp++ = *p++;
		// break at sub-word boundaries when new underscore block starts or ends
		if (isSubwordSubstitution && (('_' == *p) != startsAtUnderscore)) break;
	}
	if (nidtemp+LINEMAX <= nidsubp) Error("ID too long, buffer overflow detected.", NULL, FATAL);
	*nidsubp = 0;
	return nidtemp[0] ? nidtemp : nullptr;	// return non-empty string or nullptr
}